

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TVariable::TVariable(TVariable *this,TVariable *copyOf)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar5;
  undefined4 extraout_var_00;
  undefined1 local_30 [8];
  TConstUnionArray newArray;
  int m;
  TVariable *copyOf_local;
  TVariable *this_local;
  
  TSymbol::TSymbol(&this->super_TSymbol,&copyOf->super_TSymbol);
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_010d8ac8;
  TType::TType(&this->type,EbtVoid,EvqTemporary,1,0,0,false);
  TConstUnionArray::TConstUnionArray(&this->constArray);
  TType::deepCopy(&this->type,&copyOf->type);
  this->userType = (bool)(copyOf->userType & 1);
  this->constSubtree = (TIntermTyped *)0x0;
  (this->super_TSymbol).extensions = (TExtensionList *)0x0;
  this->memberExtensions = (TVector<glslang::TVector<const_char_*>_> *)0x0;
  iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x11])();
  if (0 < iVar2) {
    uVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x11])();
    iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x12])();
    (*(this->super_TSymbol)._vptr_TSymbol[0x10])(this,(ulong)uVar3,CONCAT44(extraout_var,iVar2));
  }
  uVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x1f])();
  if ((uVar3 & 1) != 0) {
    newArray.unionArray._4_4_ = 0;
    while( true ) {
      uVar3 = newArray.unionArray._4_4_;
      this_00 = &TType::getStruct(&copyOf->type)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (this_00);
      if ((int)sVar5 <= (int)uVar3) break;
      iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x20])
                        (copyOf,(ulong)newArray.unionArray._4_4_);
      uVar3 = newArray.unionArray._4_4_;
      if (0 < iVar2) {
        uVar4 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x20])
                          (copyOf,(ulong)newArray.unionArray._4_4_);
        iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x21])
                          (copyOf,(ulong)newArray.unionArray._4_4_);
        (*(this->super_TSymbol)._vptr_TSymbol[0x1e])
                  (this,(ulong)uVar3,(ulong)uVar4,CONCAT44(extraout_var_00,iVar2));
      }
      newArray.unionArray._4_4_ = newArray.unionArray._4_4_ + 1;
    }
  }
  bVar1 = TConstUnionArray::empty(&copyOf->constArray);
  if (!bVar1) {
    bVar1 = TType::isStruct(&copyOf->type);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("! copyOf.type.isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.cpp"
                    ,0x189,"glslang::TVariable::TVariable(const TVariable &)");
    }
    iVar2 = TConstUnionArray::size(&copyOf->constArray);
    TConstUnionArray::TConstUnionArray((TConstUnionArray *)local_30,&copyOf->constArray,0,iVar2);
    TConstUnionArray::operator=(&this->constArray,(TConstUnionArray *)local_30);
    TConstUnionArray::~TConstUnionArray((TConstUnionArray *)local_30);
  }
  return;
}

Assistant:

TVariable::TVariable(const TVariable& copyOf) : TSymbol(copyOf)
{
    type.deepCopy(copyOf.type);
    userType = copyOf.userType;

    // we don't support specialization-constant subtrees in cloned tables, only extensions
    constSubtree = nullptr;
    extensions = nullptr;
    memberExtensions = nullptr;
    if (copyOf.getNumExtensions() > 0)
        setExtensions(copyOf.getNumExtensions(), copyOf.getExtensions());
    if (copyOf.hasMemberExtensions()) {
        for (int m = 0; m < (int)copyOf.type.getStruct()->size(); ++m) {
            if (copyOf.getNumMemberExtensions(m) > 0)
                setMemberExtensions(m, copyOf.getNumMemberExtensions(m), copyOf.getMemberExtensions(m));
        }
    }

    if (! copyOf.constArray.empty()) {
        assert(! copyOf.type.isStruct());
        TConstUnionArray newArray(copyOf.constArray, 0, copyOf.constArray.size());
        constArray = newArray;
    }
}